

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

void EV_LightChange(int tag,int value)

{
  uint uVar1;
  int iVar2;
  FSectorTagIterator it;
  FSectorTagIterator local_20;
  
  if (tag == 0) {
    local_20.start = 0;
  }
  else {
    local_20.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  local_20.searchtag = tag;
  uVar1 = FSectorTagIterator::Next(&local_20);
  if (-1 < (int)uVar1) {
    do {
      iVar2 = sectors[uVar1].lightlevel + value;
      if (0x7ffe < iVar2) {
        iVar2 = 0x7fff;
      }
      if (iVar2 < -0x7fff) {
        iVar2 = -0x8000;
      }
      sectors[uVar1].lightlevel = (short)iVar2;
      uVar1 = FSectorTagIterator::Next(&local_20);
    } while (-1 < (int)uVar1);
  }
  return;
}

Assistant:

void EV_LightChange (int tag, int value)
{
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sectors[secnum].SetLightLevel(sectors[secnum].lightlevel + value);
	}
}